

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

void __thiscall Chainstate::PruneAndFlush(Chainstate *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string_view source_file;
  bool bVar3;
  Logger *pLVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  BlockValidationState state;
  string log_msg;
  string local_140;
  ValidationState<BlockValidationResult> local_120 [2];
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &local_120[0].m_reject_reason.field_2;
  local_120[0].m_mode = M_VALID;
  local_120[0].m_result = BLOCK_RESULT_UNSET;
  local_120[0].m_reject_reason._M_string_length = 0;
  local_120[0].m_reject_reason.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_120[0].m_debug_message.field_2;
  local_120[0].m_debug_message._M_string_length = 0;
  local_120[0].m_debug_message.field_2._M_local_buf[0] = '\0';
  this->m_blockman->m_check_for_pruning = true;
  local_120[0].m_reject_reason._M_dataplus._M_p = (pointer)paVar1;
  local_120[0].m_debug_message._M_dataplus._M_p = (pointer)paVar2;
  bVar3 = FlushStateToDisk(this,(BlockValidationState *)local_120,NONE,0);
  if (!bVar3) {
    ValidationState<BlockValidationResult>::ToString_abi_cxx11_(&local_140,local_120);
    pLVar4 = LogInstance();
    bVar3 = BCLog::Logger::Enabled(pLVar4);
    if (bVar3) {
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      tinyformat::format<char[14],std::__cxx11::string>
                (&local_78,(tinyformat *)"%s: failed to flush state (%s)\n","PruneAndFlush",
                 (char (*) [14])&local_140,in_R8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_58,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      pLVar4 = LogInstance();
      local_78._M_dataplus._M_p = (pointer)0x57;
      local_78._M_string_length = 0x837769;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
      ;
      source_file._M_len = 0x57;
      str._M_str = local_58._M_dataplus._M_p;
      str._M_len = local_58._M_string_length;
      logging_function._M_str = "PruneAndFlush";
      logging_function._M_len = 0xd;
      BCLog::Logger::LogPrintStr(pLVar4,str,logging_function,source_file,0xb7f,ALL,Info);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120[0].m_debug_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_120[0].m_debug_message._M_dataplus._M_p,
                    CONCAT71(local_120[0].m_debug_message.field_2._M_allocated_capacity._1_7_,
                             local_120[0].m_debug_message.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120[0].m_reject_reason._M_dataplus._M_p != paVar1) {
    operator_delete(local_120[0].m_reject_reason._M_dataplus._M_p,
                    CONCAT71(local_120[0].m_reject_reason.field_2._M_allocated_capacity._1_7_,
                             local_120[0].m_reject_reason.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Chainstate::PruneAndFlush()
{
    BlockValidationState state;
    m_blockman.m_check_for_pruning = true;
    if (!this->FlushStateToDisk(state, FlushStateMode::NONE)) {
        LogPrintf("%s: failed to flush state (%s)\n", __func__, state.ToString());
    }
}